

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitObjectSpreadNode
               (ParseNode *spreadNode,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ParseNode *pnode;
  ParseNodeUni *pPVar1;
  
  pPVar1 = ParseNode::AsParseNodeUni(spreadNode);
  pnode = pPVar1->pnode1;
  Emit(pnode,byteCodeGenerator,funcInfo,0,false,false);
  Js::ByteCodeWriter::Reg2
            (&byteCodeGenerator->m_writer,SpreadObjectLiteral,pnode->location,objectLocation);
  FuncInfo::ReleaseLoc(funcInfo,pnode);
  return;
}

Assistant:

void EmitObjectSpreadNode(ParseNode *spreadNode, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    Js::RegSlot fromObjectLocation;
    ParseNode *exprNode = spreadNode->AsParseNodeUni()->pnode1;
    Emit(exprNode, byteCodeGenerator, funcInfo, false);
    fromObjectLocation = exprNode->location;
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::SpreadObjectLiteral, fromObjectLocation, objectLocation);
    funcInfo->ReleaseLoc(exprNode);
}